

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O1

ulong __thiscall CVmObjDict::rebuild_image(CVmObjDict *this,char *buf,ulong buflen)

{
  uint32_t tmp;
  rebuild_ctx ctx;
  ulong local_38;
  undefined8 local_30;
  char *local_28;
  
  local_38 = 6;
  local_30 = 0;
  CVmHashTable::enum_entries
            (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),rebuild_cb_1,&local_38);
  if (local_38 <= buflen) {
    *(undefined4 *)buf = *(undefined4 *)((this->super_CVmObject).ext_ + 0x20);
    *(undefined2 *)(buf + 4) = (undefined2)local_30;
    local_28 = buf + 6;
    CVmHashTable::enum_entries
              (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),rebuild_cb_2,&local_38);
    local_38 = (long)local_28 - (long)buf;
  }
  return local_38;
}

Assistant:

ulong CVmObjDict::rebuild_image(VMG_ char *buf, ulong buflen)
{
    rebuild_ctx ctx;
    
    /* 
     *   calculate the amount of space we need - start with the comparator
     *   object, which needs four bytes, and the entry count, which needs two
     *   bytes 
     */
    ctx.space_needed = 6;

    /* enumerate the entries to count space */
    ctx.entry_cnt = 0;
    get_ext()->hashtab_->enum_entries(&rebuild_cb_1, &ctx);

    /* if we need more space than is available, ask for more */
    if (ctx.space_needed > buflen)
        return ctx.space_needed;

    /* write the comparator object and the entry count */
    oswp4(buf, get_ext()->comparator_);
    oswp2(buf + 4, ctx.entry_cnt);

    /* start writing after the count */
    ctx.dst = buf + 6;

    /* enumerate the entries to write to the image buffer */
    get_ext()->hashtab_->enum_entries(&rebuild_cb_2, &ctx);

    /* return the size */
    return ctx.dst - buf;
}